

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_flush_flags(DisasContext_conflict2 *s)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  switch(s->cc_op) {
  case CC_OP_DYNAMIC:
    gen_helper_flush_flags(tcg_ctx_00,tcg_ctx_00->cpu_env,QREG_CC_OP);
    s->cc_op_synced = 1;
    break;
  case CC_OP_FLAGS:
    return;
  case CC_OP_ADDB:
  case CC_OP_ADDW:
  case CC_OP_ADDL:
    tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_C,QREG_CC_X);
    tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sub_i32(tcg_ctx_00,pTVar2,QREG_CC_N,QREG_CC_V);
    gen_ext(tcg_ctx_00,pTVar2,pTVar2,s->cc_op - CC_OP_ADDB,1);
    tcg_gen_xor_i32(tcg_ctx_00,pTVar1,QREG_CC_N,QREG_CC_V);
    tcg_gen_xor_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_gen_andc_i32_m68k(tcg_ctx_00,QREG_CC_V,pTVar1,QREG_CC_V);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case CC_OP_SUBB:
  case CC_OP_SUBW:
  case CC_OP_SUBL:
    tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_C,QREG_CC_X);
    tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_add_i32(tcg_ctx_00,pTVar2,QREG_CC_N,QREG_CC_V);
    gen_ext(tcg_ctx_00,pTVar2,pTVar2,s->cc_op - CC_OP_SUBB,1);
    tcg_gen_xor_i32(tcg_ctx_00,pTVar1,QREG_CC_N,pTVar2);
    tcg_gen_xor_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_gen_and_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case CC_OP_CMPB:
  case CC_OP_CMPW:
  case CC_OP_CMPL:
    tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_LTU,QREG_CC_C,QREG_CC_N,QREG_CC_V);
    tcg_gen_sub_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N,QREG_CC_V);
    gen_ext(tcg_ctx_00,QREG_CC_Z,QREG_CC_Z,s->cc_op - CC_OP_CMPB,1);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_xor_i32(tcg_ctx_00,pTVar2,QREG_CC_Z,QREG_CC_N);
    tcg_gen_xor_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V,QREG_CC_N);
    tcg_gen_and_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_N,QREG_CC_Z);
    break;
  case CC_OP_LOGIC:
    tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N);
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_C,0);
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_V,0);
    break;
  default:
    pTVar2 = tcg_const_i32_m68k(tcg_ctx_00,s->cc_op);
    gen_helper_flush_flags(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    s->cc_op_synced = 1;
  }
  s->cc_op = CC_OP_FLAGS;
  return;
}

Assistant:

static void gen_flush_flags(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv t0, t1;

    switch (s->cc_op) {
    case CC_OP_FLAGS:
        return;

    case CC_OP_ADDB:
    case CC_OP_ADDW:
    case CC_OP_ADDL:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        /* Compute signed overflow for addition.  */
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_sub_i32(tcg_ctx, t0, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, t0, t0, s->cc_op - CC_OP_ADDB, 1);
        tcg_gen_xor_i32(tcg_ctx, t1, QREG_CC_N, QREG_CC_V);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_andc_i32(tcg_ctx, QREG_CC_V, t1, QREG_CC_V);
        tcg_temp_free(tcg_ctx, t1);
        break;

    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        /* Compute signed overflow for subtraction.  */
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_add_i32(tcg_ctx, t0, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, t0, t0, s->cc_op - CC_OP_SUBB, 1);
        tcg_gen_xor_i32(tcg_ctx, t1, QREG_CC_N, t0);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t1);
        tcg_temp_free(tcg_ctx, t1);
        break;

    case CC_OP_CMPB:
    case CC_OP_CMPW:
    case CC_OP_CMPL:
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_C, QREG_CC_N, QREG_CC_V);
        tcg_gen_sub_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, QREG_CC_Z, QREG_CC_Z, s->cc_op - CC_OP_CMPB, 1);
        /* Compute signed overflow for subtraction.  */
        t0 = tcg_temp_new(tcg_ctx);
        tcg_gen_xor_i32(tcg_ctx, t0, QREG_CC_Z, QREG_CC_N);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, QREG_CC_N);
        tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, QREG_CC_Z);
        break;

    case CC_OP_LOGIC:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
        break;

    case CC_OP_DYNAMIC:
        gen_helper_flush_flags(tcg_ctx, tcg_ctx->cpu_env, QREG_CC_OP);
        s->cc_op_synced = 1;
        break;

    default:
        t0 = tcg_const_i32(tcg_ctx, s->cc_op);
        gen_helper_flush_flags(tcg_ctx, tcg_ctx->cpu_env, t0);
        tcg_temp_free(tcg_ctx, t0);
        s->cc_op_synced = 1;
        break;
    }

    /* Note that flush_flags also assigned to env->cc_op.  */
    s->cc_op = CC_OP_FLAGS;
}